

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetRuntimeHasBit
          (FieldGenerator *this,int has_index)

{
  mapped_type *this_00;
  int in_EDX;
  undefined4 in_register_00000034;
  allocator local_49;
  key_type local_48;
  string local_28;
  
  SimpleItoa_abi_cxx11_(&local_28,(protobuf *)CONCAT44(in_register_00000034,has_index),in_EDX);
  std::__cxx11::string::string((string *)&local_48,"has_index",&local_49);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->variables_,&local_48);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void FieldGenerator::SetRuntimeHasBit(int has_index) {
  variables_["has_index"] = SimpleItoa(has_index);
}